

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall FxSwitchStatement::Resolve(FxSwitchStatement *this,FCompileContext *ctx)

{
  FScriptPosition *this_00;
  char cVar1;
  uint uVar2;
  FxExpression **ppFVar3;
  long *plVar4;
  FxExpression *pFVar5;
  _func_int **pp_Var6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  FxIntCast *this_01;
  undefined4 extraout_var_00;
  long lVar9;
  FxSequence *this_02;
  FxExpression *pFVar10;
  undefined4 extraout_var_01;
  ulong uVar11;
  long lVar12;
  FCompileContext *size;
  size_t size_00;
  int iVar13;
  ulong uVar14;
  int i;
  int iVar15;
  ulong uVar16;
  CaseAddr ca;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->Condition != (FxExpression *)0x0) {
    size = ctx;
    iVar7 = (*this->Condition->_vptr_FxExpression[2])();
    pFVar10 = (FxExpression *)CONCAT44(extraout_var,iVar7);
    this->Condition = pFVar10;
    if (pFVar10 != (FxExpression *)0x0) {
      if (pFVar10->ValueType != (PType *)TypeName) {
        this_01 = (FxIntCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)size);
        FxIntCast::FxIntCast(this_01,this->Condition,false,false);
        this->Condition = (FxExpression *)this_01;
        iVar7 = (*(this_01->super_FxExpression)._vptr_FxExpression[2])(this_01);
        this->Condition = (FxExpression *)CONCAT44(extraout_var_00,iVar7);
        if ((FxExpression *)CONCAT44(extraout_var_00,iVar7) == (FxExpression *)0x0)
        goto LAB_00518728;
      }
      uVar16 = (ulong)(this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Count;
      if (uVar16 == 0) {
        size_00 = 0;
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,0,"Empty switch statement");
        iVar7 = (*this->Condition->_vptr_FxExpression[3])();
        if ((char)iVar7 == '\0') {
          pp_Var6 = (this->super_FxExpression)._vptr_FxExpression;
          pFVar10 = this->Condition;
          this->Condition = (FxExpression *)0x0;
          (*pp_Var6[1])(this);
          pFVar10->NeedResult = false;
          return pFVar10;
        }
        pFVar10 = (FxExpression *)FxExpression::operator_new((FxExpression *)0x28,size_00);
      }
      else {
        pFVar10 = ctx->ControlStmt;
        ctx->ControlStmt = &this->super_FxExpression;
        ppFVar3 = (this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Array;
        for (lVar12 = 0; uVar16 << 3 != lVar12; lVar12 = lVar12 + 8) {
          plVar4 = *(long **)((long)ppFVar3 + lVar12);
          if (plVar4 == (long *)0x0) goto LAB_00518728;
          lVar9 = (**(code **)(*plVar4 + 0x10))();
          *(long *)((long)ppFVar3 + lVar12) = lVar9;
          if (lVar9 == 0) goto LAB_00518728;
          *(undefined1 *)(lVar9 + 0x21) = 0;
        }
        ctx->ControlStmt = pFVar10;
        iVar7 = (*this->Condition->_vptr_FxExpression[3])();
        if ((char)iVar7 == '\0') {
          ppFVar3 = (this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Array;
          uVar2 = (this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Count;
          for (lVar12 = 0; (ulong)uVar2 << 3 != lVar12; lVar12 = lVar12 + 8) {
            lVar9 = *(long *)((long)ppFVar3 + lVar12);
            if ((*(int *)(lVar9 + 0x24) == 0x3d) && (*(long *)(lVar9 + 0x28) != 0)) {
              ca.casevalue = *(int *)(lVar9 + 0x30);
              ca.jumpaddress = 0;
              TArray<FxSwitchStatement::CaseAddr,_FxSwitchStatement::CaseAddr>::Push
                        (&this->CaseAddresses,&ca);
            }
          }
          return &this->super_FxExpression;
        }
        this_00 = &(this->super_FxExpression).ScriptPosition;
        pFVar10 = (FxExpression *)0x0;
        FScriptPosition::Message(this_00,0,"Case expression is constant");
        uVar16 = 0xffffffffffffffff;
        iVar7 = -1;
        uVar11 = 0xffffffff;
        for (uVar14 = 0; uVar14 < (this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Count
            ; uVar14 = uVar14 + 1) {
          pFVar5 = (this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Array[uVar14];
          if (pFVar5 != (FxExpression *)0x0) {
            iVar13 = (int)uVar14;
            if (pFVar5->ExprType == EFX_CaseStatement) {
              if (pFVar5[1]._vptr_FxExpression == (_func_int **)0x0) {
                uVar16 = uVar14 & 0xffffffff;
              }
              else {
                iVar8 = *(int *)&pFVar5[1].ScriptPosition.FileName.Chars;
                pFVar10 = this->Condition + 1;
                ExpVal::ExpVal((ExpVal *)&ca,(ExpVal *)pFVar10);
                cVar1 = *(char *)(CONCAT44(ca._4_4_,ca.casevalue) + 0x6b);
                if (cVar1 == '\x01') {
                  iVar15 = (int)(double)ca.jumpaddress;
                }
                else {
                  iVar15 = 0;
                  if (cVar1 == '\0') {
                    iVar15 = (int)ca.jumpaddress;
                  }
                }
                ExpVal::~ExpVal((ExpVal *)&ca);
                if (iVar8 == iVar15) {
                  uVar11 = uVar14 & 0xffffffff;
                }
                pp_Var6 = pFVar5[1]._vptr_FxExpression;
                if (pp_Var6 == (_func_int **)0x0) {
                  uVar16 = uVar16 & 0xffffffff;
                }
                else {
                  uVar16 = uVar16 & 0xffffffff;
                  if ((PType *)pp_Var6[3] != this->Condition->ValueType) {
                    FScriptPosition::Message
                              ((FScriptPosition *)(pp_Var6 + 1),2,"Type mismatch in case statement")
                    ;
                    goto LAB_00518728;
                  }
                }
              }
            }
            pFVar5 = (this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Array[uVar14];
            if ((pFVar5->ExprType == EFX_JumpStatement) &&
               (*(int *)&pFVar5[1]._vptr_FxExpression == 0x126)) {
              iVar8 = iVar13;
              if (-1 < iVar7) {
                iVar8 = iVar7;
              }
              if (-1 < (int)uVar16) {
                iVar7 = iVar8;
              }
              if (-1 < (int)uVar11) goto LAB_0051866c;
            }
          }
        }
        iVar13 = -1;
LAB_0051866c:
        uVar16 = uVar16 & 0xffffffff;
        if (-1 < (int)uVar11) {
          iVar7 = iVar13;
          uVar16 = uVar11;
        }
        if ((0 < (int)uVar16) && (1 < iVar7 - (int)uVar16)) {
          this_02 = (FxSequence *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pFVar10);
          FxSequence::FxSequence(this_02,this_00);
          while (uVar16 = uVar16 + 1, (int)uVar16 < iVar7) {
            pFVar10 = (this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Array[uVar16];
            if ((pFVar10 != (FxExpression *)0x0) && (pFVar10->ExprType != EFX_CaseStatement)) {
              FxSequence::Add(this_02,pFVar10);
              (this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Array[uVar16] =
                   (FxExpression *)0x0;
            }
          }
          (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
          iVar7 = (*(this_02->super_FxExpression)._vptr_FxExpression[2])(this_02,ctx);
          return (FxExpression *)CONCAT44(extraout_var_01,iVar7);
        }
        (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
        pFVar10 = (FxExpression *)FxExpression::operator_new((FxExpression *)0x28,(size_t)pFVar10);
      }
      FxNop::FxNop((FxNop *)pFVar10,&(this->super_FxExpression).ScriptPosition);
      return pFVar10;
    }
  }
LAB_00518728:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxSwitchStatement::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Condition, ctx);

	if (Condition->ValueType != TypeName)
	{
		Condition = new FxIntCast(Condition, false);
		SAFE_RESOLVE(Condition, ctx);
	}

	if (Content.Size() == 0)
	{
		ScriptPosition.Message(MSG_WARNING, "Empty switch statement");
		if (Condition->isConstant())
		{
			return new FxNop(ScriptPosition);
		}
		else
		{
			// The condition may have a side effect so it should be processed (possible to-do: Analyze all nodes in there and delete if not.)
			auto x = Condition;
			Condition = nullptr;
			delete this;
			x->NeedResult = false;
			return x;
		}
	}

	auto outerctrl = ctx.ControlStmt;
	ctx.ControlStmt = this;

	for (auto &line : Content)
	{
		SAFE_RESOLVE(line, ctx);
		line->NeedResult = false;
	}
	ctx.ControlStmt = outerctrl;

	if (Condition->isConstant())
	{
		ScriptPosition.Message(MSG_WARNING, "Case expression is constant");
		auto &content = Content;
		int defaultindex = -1;
		int defaultbreak = -1;
		int caseindex = -1;
		int casebreak = -1;
		// look for a case label with a matching value
		for (unsigned i = 0; i < content.Size(); i++)
		{
			if (content[i] != nullptr)
			{
				if (content[i]->ExprType == EFX_CaseStatement)
				{
					auto casestmt = static_cast<FxCaseStatement *>(content[i]);
					if (casestmt->Condition == nullptr) defaultindex = i;
					else if (casestmt->CaseValue == static_cast<FxConstant *>(Condition)->GetValue().GetInt()) caseindex = i;
					if (casestmt->Condition && casestmt->Condition->ValueType != Condition->ValueType)
					{
						casestmt->Condition->ScriptPosition.Message(MSG_ERROR, "Type mismatch in case statement");
						delete this;
						return nullptr;
					}
				}
				if (content[i]->ExprType == EFX_JumpStatement && static_cast<FxJumpStatement *>(content[i])->Token == TK_Break)
				{
					if (defaultindex >= 0 && defaultbreak < 0) defaultbreak = i;
					if (caseindex >= 0 && casebreak < 0)
					{
						casebreak = i;
						break;	// when we find this we do not need to look any further.
					}
				}
			}
		}
		if (caseindex < 0)
		{
			caseindex = defaultindex;
			casebreak = defaultbreak;
		}
		if (caseindex > 0 && casebreak - caseindex > 1)
		{
			auto seq = new FxSequence(ScriptPosition);
			for (int i = caseindex + 1; i < casebreak; i++)
			{
				if (content[i] != nullptr && content[i]->ExprType != EFX_CaseStatement)
				{
					seq->Add(content[i]);
					content[i] = nullptr;
				}
			}
			delete this;
			return seq->Resolve(ctx);
		}
		delete this;
		return new FxNop(ScriptPosition);
	}

	int mincase = INT_MAX;
	int maxcase = INT_MIN;
	for (auto line : Content)
	{
		if (line->ExprType == EFX_CaseStatement)
		{
			auto casestmt = static_cast<FxCaseStatement *>(line);
			if (casestmt->Condition != nullptr)
			{
				CaseAddr ca = { casestmt->CaseValue, 0 };
				CaseAddresses.Push(ca);
				if (ca.casevalue < mincase) mincase = ca.casevalue;
				if (ca.casevalue > maxcase) maxcase = ca.casevalue;
			}
		}
	}
	return this;
}